

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall SVGChart::PPlot::DrawYAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float extraout_XMM0_Da;
  bool theIsMajorTick;
  float local_b8;
  float theY;
  long local_b0;
  long local_a8;
  PStyle *local_a0;
  string theLabel;
  PRect theTickRect;
  string theFormatString;
  
  local_a0 = &(this->mYAxisSetup).mStyle;
  (*inPainter->_vptr_Painter[0xc])(inPainter);
  lVar5 = inRect->mH;
  fVar6 = 0.0;
  if ((this->mYAxisSetup).mCrossOrigin == false) {
    if ((this->mXAxisSetup).mAscending == true) {
      fVar6 = (this->mXAxisSetup).mMin;
    }
    else {
      fVar6 = (this->mXAxisSetup).mMax;
    }
  }
  uVar4 = inRect->mX;
  lVar3 = inRect->mY;
  (*this->mXTrafo->_vptr_Trafo[2])(fVar6);
  local_b8 = extraout_XMM0_Da;
  (**inPainter->_vptr_Painter)(inPainter);
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mTickInfo.mStyle);
  iVar1 = (*this->mYTickIterator->_vptr_TickIterator[2])();
  if ((char)iVar1 == '\0') {
    bVar2 = false;
  }
  else {
    theFormatString._M_dataplus._M_p = (pointer)&theFormatString.field_2;
    theFormatString._M_string_length = 0;
    theFormatString.field_2._M_local_buf[0] = '\0';
    theTickRect.mW = 0;
    theTickRect.mH = 0;
    theTickRect.mX = 0;
    theTickRect.mY = 0;
    if ((this->mYAxisSetup).mTickInfo.mTicksOn == true) {
      local_b0 = lVar3;
      local_a8 = lVar5;
      while (iVar1 = (*this->mYTickIterator->_vptr_TickIterator[3])
                               (this->mYTickIterator,&theY,&theIsMajorTick,&theFormatString),
            lVar3 = local_b0, lVar5 = local_a8, (char)iVar1 != '\0') {
        iVar1 = (*(this->super_PDrawer)._vptr_PDrawer[0xd])
                          (theY,this,(ulong)(uint)(int)local_b8,(ulong)theIsMajorTick,
                           &theFormatString,inPainter,&theTickRect);
        if ((char)iVar1 == '\0') {
          bVar2 = false;
          goto LAB_00105ff8;
        }
        if (theTickRect.mX < (long)uVar4) {
          uVar4 = theTickRect.mX;
        }
      }
    }
    (*inPainter->_vptr_Painter[0xc])(inPainter,local_a0);
    std::__cxx11::string::string((string *)&theLabel,(string *)&(this->mYAxisSetup).mLabel);
    if (theLabel._M_string_length != 0) {
      iVar1 = (*inPainter->_vptr_Painter[8])(inPainter,theLabel._M_dataplus._M_p);
      (*inPainter->_vptr_Painter[0xb])
                (0xc2b40000,inPainter,uVar4 & 0xffffffff,
                 (ulong)(uint)((int)lVar3 + (int)lVar5 + (int)((lVar5 - iVar1) / -2)),
                 theLabel._M_dataplus._M_p);
    }
    std::__cxx11::string::~string((string *)&theLabel);
    bVar2 = true;
LAB_00105ff8:
    std::__cxx11::string::~string((string *)&theFormatString);
  }
  return bVar2;
}

Assistant:

bool PPlot::DrawYAxis (const PRect &inRect, Painter &inPainter) const {
      inPainter.SetStyle (mYAxisSetup.mStyle);
      float theX1;
      PRect theRect = inRect;
      float theTargetX = 0;
      if (!mYAxisSetup.mCrossOrigin) {
        if (mXAxisSetup.mAscending) {
          theTargetX = mXAxisSetup.mMin;
        }
        else {
          theTargetX = mXAxisSetup.mMax;
        }
      }
      theX1 = mXTrafo->Transform (theTargetX);

      int theY1 = inRect.mY;
      float theX2 = theX1;
      int theY2 = theY1+theRect.mH;

      // draw y axis
      inPainter.DrawLine (theX1, theY1, theX2, theY2);

      // ticks
      inPainter.SetStyle (mYAxisSetup.mTickInfo.mStyle);
      if (!mYTickIterator->Init ()) {
        return false;
      }

      float theY;
      bool theIsMajorTick;
      string theFormatString;
      PRect theTickRect;

      if (mYAxisSetup.mTickInfo.mTicksOn) {
          while (mYTickIterator->GetNextTick (theY, theIsMajorTick, theFormatString)) {
              if (!DrawYTick (theY, theX1, theIsMajorTick, theFormatString, inPainter, theTickRect)) {
                  return false;
              }

              if (theTickRect.mX < theRect.mX) {
                  theRect.mX = theTickRect.mX;
              }
          }
      }
      
      // draw label
      inPainter.SetStyle (mYAxisSetup.mStyle);
      string theLabel = mYAxisSetup.mLabel;
      if (theLabel.size ()>0) {
        int theW = inPainter.CalculateTextDrawSize (theLabel.c_str ());
        int theX = theRect.mX;
        int theY = theRect.mY + theRect.mH - (theRect.mH-theW)/2;
        inPainter.DrawRotatedText (theX, theY, -90, theLabel.c_str ());
      }

      return true;
    }